

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double dVar1;
  FilterType filter2;
  FilterType filter;
  array<double,_5UL> aStack_728;
  array<double,_5UL> local_700;
  PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8> local_6d8;
  PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8> local_380;
  
  std::operator<<((ostream *)&std::cout,"Creating and testing filter using automatic decl\n");
  Iir::PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter(&local_380);
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)&local_380,0.1);
  testFilter(&local_700,(FilterType *)&local_380);
  std::operator<<((ostream *)&std::cout,"Creating and testing filter using object assignment\n");
  memset(&local_6d8,0,0x358);
  Iir::PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter(&local_6d8);
  Iir::CascadeStages<4,_Iir::DirectFormII>::reset
            (&local_380.super_CascadeStages<4,_Iir::DirectFormII>);
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)&local_380,0.1);
  testFilter(&aStack_728,(FilterType *)&local_380);
  dVar1 = sq_err(&local_700,&aStack_728);
  assert_print((uint)(dVar1 < 1e-10),
               "Filter produces different results after initialisation by assignment.\n");
  memcpy(&local_6d8,&local_380,0x358);
  std::operator<<((ostream *)&std::cout,"Calculating continued response using original filter:\n");
  testFilter(&local_700,(FilterType *)&local_380);
  std::operator<<((ostream *)&std::cout,"Calculating continued response using assigned filter:\n");
  testFilter(&aStack_728,(FilterType *)&local_6d8);
  dVar1 = sq_err(&local_700,(array<double,_5UL> *)&DAT_00106248);
  assert_print((uint)(dVar1 < 1e-10),"Incorrect result from original filter.\n");
  dVar1 = sq_err(&local_700,&aStack_728);
  assert_print((uint)(dVar1 < 1e-10),"Filter iterates inconsistently after copy.\n");
  std::operator<<((ostream *)&std::cout,
                  "Checking continued responses differ when second filter changes cutoff:\n");
  Iir::Butterworth::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)&local_6d8,0.3);
  testFilter(&local_700,(FilterType *)&local_380);
  testFilter(&aStack_728,(FilterType *)&local_6d8);
  dVar1 = sq_err(&local_700,&aStack_728);
  assert_print((uint)(0.001 < dVar1),
               "Altering assigned filter cutoff also changes original filter.\n");
  return 0;
}

Assistant:

int main(int, char**) {
    // setup & test 1st time
    std::cout << "Creating and testing filter using automatic decl\n";
    FilterType filter;
    filter.setupN(0.1);
    std::array<double, test_len> res1 { testFilter(filter) }; 
    // Test response: [0.192873, -0.427308, -0.00869136, 0.266734, 0.2204]

    // setup & test 2nd time
    std::cout << "Creating and testing filter using object assignment\n";
    filter = FilterType();  // this assignment seems to be the problem
    filter.setupN(0.1);
    std::array<double, test_len> res2 { testFilter(filter) }; 
    assert_print(sq_err(res1, res2) < 1e-10,
                 "Filter produces different results after initialisation by assignment.\n");
    
    // Copy into new filter and check same result from each.
    FilterType filter2 = filter;
    std::cout << "Calculating continued response using original filter:\n";
    res1 = testFilter(filter);
    std::cout << "Calculating continued response using assigned filter:\n";
    res2 = testFilter(filter2);
    assert_print(sq_err(res1, std::array<double, test_len> {
                          0.0189142, -0.150791, -0.197797, -0.129944, -0.00990682
                        }) < 1e-10,
                 "Incorrect result from original filter.\n");
    assert_print(sq_err(res1, res2) < 1e-10,
                 "Filter iterates inconsistently after copy.\n");
    
    std::cout << "Checking continued responses differ when second filter changes cutoff:\n";
    filter2.setupN(0.3);
    res1 = testFilter(filter);
    res2 = testFilter(filter2);
    assert_print(sq_err(res1, res2) > 1e-3,
                 "Altering assigned filter cutoff also changes original filter.\n");
    
    
    return 0;
}